

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

bool __thiscall spvtools::AssemblyContext::isStartOfNewInst(AssemblyContext *this)

{
  spv_text text;
  char *pcVar1;
  spv_result_t sVar2;
  int iVar3;
  bool bVar4;
  spv_position_t pos;
  string word;
  spv_position_t local_58;
  string local_38;
  
  local_58.index = (this->current_position_).index;
  local_58.line = (this->current_position_).line;
  local_58.column = (this->current_position_).column;
  sVar2 = anon_unknown_6::advance(this->text_,&local_58);
  if (sVar2 == SPV_SUCCESS) {
    text = this->text_;
    if ((((text->length < local_58.index + 3) || (pcVar1 = text->str, pcVar1[local_58.index] != 'O')
         ) || (pcVar1[local_58.index + 1] != 'p')) ||
       (bVar4 = true, 0x19 < (byte)(pcVar1[local_58.index + 2] + 0xbfU))) {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
      local_58.line = (this->current_position_).line;
      local_58.column = (this->current_position_).column;
      local_58.index = (this->current_position_).index;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      sVar2 = anon_unknown_6::getWord(text,&local_58,&local_38);
      if (((((sVar2 == SPV_SUCCESS) && (*local_38._M_dataplus._M_p == '%')) &&
           ((sVar2 = anon_unknown_6::advance(this->text_,&local_58), sVar2 == SPV_SUCCESS &&
            ((sVar2 = anon_unknown_6::getWord(this->text_,&local_58,&local_38), sVar2 == SPV_SUCCESS
             && (iVar3 = std::__cxx11::string::compare((char *)&local_38), iVar3 == 0)))))) &&
          (sVar2 = anon_unknown_6::advance(this->text_,&local_58), sVar2 == SPV_SUCCESS)) &&
         (local_58.index + 3 <= this->text_->length)) {
        pcVar1 = this->text_->str;
        bVar4 = false;
        if ((pcVar1[local_58.index] == 'O') && (bVar4 = false, pcVar1[local_58.index + 1] == 'p')) {
          bVar4 = (byte)(pcVar1[local_58.index + 2] + 0xbfU) < 0x1a;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,
                        CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                                 local_38.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool AssemblyContext::isStartOfNewInst() {
  spv_position_t pos = current_position_;
  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;

  std::string word;
  pos = current_position_;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ('%' != word.front()) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ("=" != word) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;
  return false;
}